

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::ktx_texture::read_from_stream(ktx_texture *this,data_stream_serializer *serializer)

{
  vector<unsigned_char> *pvVar1;
  uint32 uVar2;
  vector<unsigned_char> *pvVar3;
  bool bVar4;
  uint slice_size;
  int iVar5;
  uint uVar6;
  uint size_in_bytes;
  ssize_t sVar7;
  ulong uVar8;
  byte bVar9;
  uint mip_level;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint32 uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint32 uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  uint32 key_value_byte_size;
  uint local_90;
  uint local_8c;
  vector<crnlib::vector<unsigned_char>_> *local_88;
  uint local_80;
  uint8 pad_bytes [3];
  uint8_vec key_value_data;
  undefined4 extraout_var;
  
  clear(this);
  iVar5 = (*serializer->m_pStream->_vptr_data_stream[4])(serializer->m_pStream,this,0x40);
  if (((iVar5 == 0x40) && (iVar5 = bcmp(s_ktx_file_id,this,0xc), iVar5 == 0)) &&
     ((uVar19 = (this->m_header).m_endianness, uVar19 == 0x4030201 || (uVar19 == 0x1020304)))) {
    this->m_opposite_endianness = uVar19 == 0x1020304;
    if (uVar19 == 0x1020304) {
      ktx_header::endian_swap(&this->m_header);
      uVar10 = (this->m_header).m_glTypeSize;
      if (4 < uVar10) {
        return false;
      }
      if ((0x16U >> (uVar10 & 0x1f) & 1) == 0) {
        return false;
      }
    }
    bVar4 = check_header(this);
    if (bVar4) {
      bVar4 = compute_pixel_info(this);
      if (!bVar4) {
        return false;
      }
      uVar19 = (this->m_header).m_bytesOfKeyValueData;
      local_88 = &this->m_key_values;
      while (uVar19 != 0) {
        if (uVar19 < 4) {
          return false;
        }
        iVar5 = (*serializer->m_pStream->_vptr_data_stream[4])
                          (serializer->m_pStream,&key_value_byte_size,4);
        if (iVar5 != 4) {
          return false;
        }
        if (this->m_opposite_endianness == true) {
          key_value_byte_size =
               key_value_byte_size >> 0x18 | (key_value_byte_size & 0xff0000) >> 8 |
               (key_value_byte_size & 0xff00) << 8 | key_value_byte_size << 0x18;
        }
        uVar19 = uVar19 - 4;
        if (uVar19 < key_value_byte_size) {
          return false;
        }
        key_value_data.m_p = (uchar *)0x0;
        key_value_data.m_size = 0;
        key_value_data.m_capacity = 0;
        if (key_value_byte_size == 0) {
LAB_00173390:
          vector<crnlib::vector<unsigned_char>_>::push_back(local_88,&key_value_data);
          uVar10 = key_value_byte_size - 1 & 3;
          uVar12 = uVar10 ^ 3;
          if ((uVar10 == 3) ||
             (sVar7 = data_stream_serializer::read
                                (serializer,(int)pad_bytes,(void *)0x1,(ulong)uVar12),
             (uint)sVar7 == uVar12)) {
            bVar4 = uVar12 <= uVar19 - key_value_byte_size;
            if (!bVar4) {
              uVar12 = 0;
            }
            uVar19 = (uVar19 - key_value_byte_size) - uVar12;
          }
          else {
            bVar4 = false;
          }
        }
        else {
          vector<unsigned_char>::resize(&key_value_data,key_value_byte_size,false);
          sVar7 = data_stream_serializer::read
                            (serializer,(int)key_value_data.m_p,(void *)0x1,
                             (ulong)key_value_byte_size);
          if ((uint32)sVar7 == key_value_byte_size) goto LAB_00173390;
          bVar4 = false;
        }
        vector<unsigned_char>::~vector(&key_value_data);
        if (!bVar4) {
          return false;
        }
      }
      uVar19 = (this->m_header).m_numberOfMipmapLevels;
      iVar5 = uVar19 + (uVar19 == 0);
      uVar19 = (this->m_header).m_numberOfArrayElements;
      iVar16 = uVar19 + (uVar19 == 0);
      uVar15 = (this->m_header).m_pixelDepth;
      local_88 = (vector<crnlib::vector<unsigned_char>_> *)CONCAT44(local_88._4_4_,iVar5);
      uVar2 = (this->m_header).m_numberOfFaces;
      uVar10 = uVar15 + (uVar15 == 0);
      if (0xffff0000 < uVar2 * uVar10 * iVar16 * iVar5 - 0x10000) {
        local_90 = (this->m_header).m_pixelWidth;
        uVar15 = (this->m_header).m_pixelHeight;
        uVar12 = this->m_block_dim;
        local_80 = uVar15 + (uVar15 == 0);
        iVar11 = 0;
        if (-local_80 < uVar12 || -local_90 < uVar12) {
          return false;
        }
        uVar20 = 0;
        for (; iVar11 != iVar5; iVar11 = iVar11 + 1) {
          bVar9 = (byte)iVar11;
          uVar13 = local_90 >> (bVar9 & 0x1f);
          uVar6 = local_80 >> (bVar9 & 0x1f);
          uVar18 = uVar10 >> (bVar9 & 0x1f);
          uVar13 = uVar13 + (uVar13 == 0) + (uVar12 - 1);
          if (uVar13 < uVar12) {
            return false;
          }
          uVar6 = uVar6 + (uVar6 == 0) + (uVar12 - 1);
          if (uVar6 < uVar12) {
            return false;
          }
          uVar20 = uVar20 + 4;
          uVar6 = (uVar13 / uVar12) * (uVar6 / uVar12) * this->m_bytes_per_block;
          if (uVar19 == 0 && uVar2 == 6) {
            iVar14 = 6;
            while (bVar4 = iVar14 != 0, iVar14 = iVar14 + -1, bVar4) {
              uVar20 = uVar20 + uVar6 + (ulong)(-uVar6 & 3);
            }
          }
          else {
            uVar13 = 0;
            for (iVar14 = 0; iVar14 != iVar16; iVar14 = iVar14 + 1) {
              for (uVar15 = 0; iVar22 = uVar18 + (uVar18 == 0), uVar15 != uVar2; uVar15 = uVar15 + 1
                  ) {
                while (iVar22 != 0) {
                  uVar13 = uVar13 + uVar6;
                  iVar22 = iVar22 + -1;
                }
              }
            }
            uVar20 = uVar20 + uVar13 + (ulong)(-uVar13 & 3);
          }
        }
        iVar5 = (*serializer->m_pStream->_vptr_data_stream[10])();
        uVar8 = CONCAT44(extraout_var,iVar5);
        if (uVar8 < uVar20) {
          console::warning(
                          "ktx_texture::read_from_stream: KTX file size is smaller than expected - trying to read anyway without imageSize fields"
                          );
        }
        uVar10 = 0;
        while( true ) {
          uVar19 = (this->m_header).m_numberOfMipmapLevels;
          bVar4 = uVar19 + (uVar19 == 0) <= uVar10;
          if (bVar4) {
            return bVar4;
          }
          bVar9 = (byte)uVar10;
          uVar6 = (this->m_header).m_pixelWidth >> (bVar9 & 0x1f);
          uVar19 = (this->m_header).m_pixelHeight;
          uVar18 = uVar19 + (uVar19 == 0) >> (bVar9 & 0x1f);
          uVar19 = (this->m_header).m_pixelDepth;
          uVar13 = uVar19 + (uVar19 == 0) >> (bVar9 & 0x1f);
          uVar13 = uVar13 + (uVar13 == 0);
          uVar12 = this->m_block_dim;
          uVar17 = (uVar12 + uVar6 + (uVar6 == 0)) - 1;
          uVar21 = uVar17 / uVar12;
          uVar6 = (uVar18 + (uVar18 == 0) + uVar12) - 1;
          local_8c = uVar6 / uVar12;
          if (uVar17 < uVar12) {
            return bVar4;
          }
          if (uVar6 < uVar12) {
            return bVar4;
          }
          key_value_byte_size = 0;
          if (uVar8 < uVar20) {
            uVar19 = (this->m_header).m_numberOfArrayElements;
            key_value_byte_size =
                 local_8c * uVar21 * uVar13 * this->m_bytes_per_block * (uVar19 + (uVar19 == 0)) *
                 (this->m_header).m_numberOfFaces;
          }
          else {
            iVar5 = (*serializer->m_pStream->_vptr_data_stream[4])
                              (serializer->m_pStream,&key_value_byte_size,4);
            if (iVar5 != 4) {
              return false;
            }
            if (this->m_opposite_endianness == true) {
              key_value_byte_size =
                   key_value_byte_size >> 0x18 | (key_value_byte_size & 0xff0000) >> 8 |
                   (key_value_byte_size & 0xff00) << 8 | key_value_byte_size << 0x18;
            }
          }
          if (key_value_byte_size == 0) break;
          uVar19 = (this->m_header).m_numberOfArrayElements;
          uVar12 = (this->m_header).m_numberOfFaces;
          if (uVar12 == 6 && uVar19 == 0) {
            iVar5 = 0;
            uVar12 = 6;
            uVar6 = 0;
            while (uVar6 < uVar12) {
              local_88 = (vector<crnlib::vector<unsigned_char>_> *)CONCAT44(local_88._4_4_,iVar5);
              key_value_data.m_p = (uchar *)0x0;
              key_value_data.m_size = 0;
              key_value_data.m_capacity = 0;
              local_90 = uVar6;
              vector<crnlib::vector<unsigned_char>_>::push_back(&this->m_image_data,&key_value_data)
              ;
              vector<unsigned_char>::~vector(&key_value_data);
              pvVar3 = (this->m_image_data).m_p;
              uVar12 = (this->m_image_data).m_size - 1;
              pvVar1 = pvVar3 + uVar12;
              vector<unsigned_char>::resize(pvVar1,key_value_byte_size,false);
              sVar7 = data_stream_serializer::read
                                (serializer,(int)pvVar3[uVar12].m_p,(void *)0x1,
                                 (ulong)key_value_byte_size);
              size_in_bytes = (uint)sVar7;
              if (size_in_bytes != key_value_byte_size) {
                return false;
              }
              if (this->m_opposite_endianness == true) {
                utils::endian_swap_mem(pvVar1->m_p,size_in_bytes,(this->m_header).m_glTypeSize);
                size_in_bytes = key_value_byte_size;
              }
              uVar12 = -size_in_bytes & 3;
              if (uVar8 < uVar20) {
                uVar12 = 0;
              }
              sVar7 = data_stream_serializer::read
                                (serializer,(int)pad_bytes,(void *)0x1,(ulong)uVar12);
              if ((uint)sVar7 != uVar12) {
                return false;
              }
              iVar5 = uVar12 + (int)local_88 + key_value_byte_size;
              uVar12 = (this->m_header).m_numberOfFaces;
              uVar6 = local_90 + 1;
            }
          }
          else {
            local_8c = local_8c * uVar21;
            iVar5 = 0;
            uVar15 = key_value_byte_size;
            for (uVar6 = 0; uVar6 < uVar19 + (uVar19 == 0); uVar6 = uVar6 + 1) {
              for (uVar18 = 0; uVar17 = uVar13, uVar18 < uVar12; uVar18 = uVar18 + 1) {
                while (uVar17 != 0) {
                  local_88 = (vector<crnlib::vector<unsigned_char>_> *)
                             CONCAT44(local_88._4_4_,iVar5);
                  uVar12 = this->m_bytes_per_block * local_8c;
                  if (uVar15 <= uVar12 - 1) {
                    return false;
                  }
                  key_value_data.m_p = (uchar *)0x0;
                  key_value_data.m_size = 0;
                  key_value_data.m_capacity = 0;
                  local_90 = uVar17 - 1;
                  local_80 = uVar15;
                  vector<crnlib::vector<unsigned_char>_>::push_back
                            (&this->m_image_data,&key_value_data);
                  vector<unsigned_char>::~vector(&key_value_data);
                  pvVar3 = (this->m_image_data).m_p;
                  uVar17 = (this->m_image_data).m_size - 1;
                  pvVar1 = pvVar3 + uVar17;
                  vector<unsigned_char>::resize(pvVar1,uVar12,false);
                  sVar7 = data_stream_serializer::read
                                    (serializer,(int)pvVar3[uVar17].m_p,(void *)0x1,(ulong)uVar12);
                  uVar17 = local_80;
                  if ((uint)sVar7 != uVar12) {
                    return false;
                  }
                  if (this->m_opposite_endianness == true) {
                    utils::endian_swap_mem(pvVar1->m_p,uVar12,(this->m_header).m_glTypeSize);
                  }
                  uVar15 = uVar17 - uVar12;
                  iVar5 = (int)local_88 + uVar12;
                  uVar17 = local_90;
                }
                uVar12 = (this->m_header).m_numberOfFaces;
              }
              uVar19 = (this->m_header).m_numberOfArrayElements;
            }
            if (uVar15 != 0) {
              return false;
            }
          }
          uVar12 = -iVar5 & 3;
          if (uVar8 < uVar20) {
            uVar12 = 0;
          }
          sVar7 = data_stream_serializer::read(serializer,(int)pad_bytes,(void *)0x1,(ulong)uVar12);
          if ((uint)sVar7 != uVar12) {
            return false;
          }
          uVar10 = uVar10 + 1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ktx_texture::read_from_stream(data_stream_serializer& serializer)
    {
        clear();

        // Read header
        if (serializer.read(&m_header, 1, sizeof(m_header)) != sizeof(ktx_header))
        {
            return false;
        }

        // Check header
        if (memcmp(s_ktx_file_id, m_header.m_identifier, sizeof(m_header.m_identifier)))
        {
            return false;
        }

        if ((m_header.m_endianness != KTX_OPPOSITE_ENDIAN) && (m_header.m_endianness != KTX_ENDIAN))
        {
            return false;
        }

        m_opposite_endianness = (m_header.m_endianness == KTX_OPPOSITE_ENDIAN);
        if (m_opposite_endianness)
        {
            m_header.endian_swap();

            if ((m_header.m_glTypeSize != sizeof(uint8)) && (m_header.m_glTypeSize != sizeof(uint16)) && (m_header.m_glTypeSize != sizeof(uint32)))
            {
                return false;
            }
        }

        if (!check_header())
        {
            return false;
        }

        if (!compute_pixel_info())
        {
            return false;
        }

        uint8 pad_bytes[3];

        // Read the key value entries
        uint num_key_value_bytes_remaining = m_header.m_bytesOfKeyValueData;
        while (num_key_value_bytes_remaining)
        {
            if (num_key_value_bytes_remaining < sizeof(uint32))
            {
                return false;
            }

            uint32 key_value_byte_size;
            if (serializer.read(&key_value_byte_size, 1, sizeof(uint32)) != sizeof(uint32))
            {
                return false;
            }

            num_key_value_bytes_remaining -= sizeof(uint32);

            if (m_opposite_endianness)
            {
                key_value_byte_size = utils::swap32(key_value_byte_size);
            }

            if (key_value_byte_size > num_key_value_bytes_remaining)
            {
                return false;
            }

            uint8_vec key_value_data;
            if (key_value_byte_size)
            {
                key_value_data.resize(key_value_byte_size);
                if (serializer.read(&key_value_data[0], 1, key_value_byte_size) != key_value_byte_size)
                {
                    return false;
                }
            }

            m_key_values.push_back(key_value_data);

            uint padding = 3 - ((key_value_byte_size + 3) % 4);
            if (padding)
            {
                if (serializer.read(pad_bytes, 1, padding) != padding)
                {
                    return false;
                }
            }

            num_key_value_bytes_remaining -= key_value_byte_size;
            if (num_key_value_bytes_remaining < padding)
            {
                return false;
            }
            num_key_value_bytes_remaining -= padding;
        }

        // Now read the mip levels
        uint total_faces = get_num_mips() * get_array_size() * get_num_faces() * get_depth();
        if ((!total_faces) || (total_faces > 65535))
        {
            return false;
        }

// See Section 2.8 of KTX file format: No rounding to block sizes should be applied for block compressed textures.
// OK, I'm going to break that rule otherwise KTX can only store a subset of textures that DDS can handle for no good reason.
#if 0
      const uint mip0_row_blocks = m_header.m_pixelWidth / m_block_dim;
      const uint mip0_col_blocks = CRNLIB_MAX(1, m_header.m_pixelHeight) / m_block_dim;
#else
        const uint mip0_row_blocks = (m_header.m_pixelWidth + m_block_dim - 1) / m_block_dim;
        const uint mip0_col_blocks = (CRNLIB_MAX(1, m_header.m_pixelHeight) + m_block_dim - 1) / m_block_dim;
#endif
        if ((!mip0_row_blocks) || (!mip0_col_blocks))
        {
            return false;
        }

        bool has_valid_image_size_fields = true;
        bool disable_mip_and_cubemap_padding = false;

#if CRNLIB_KTX_PVRTEX_WORKAROUNDS
        {
            // PVRTexTool has a bogus KTX writer that doesn't write any imageSize fields. Nice.
            size_t expected_bytes_remaining = 0;
            for (uint mip_level = 0; mip_level < get_num_mips(); mip_level++)
            {
                uint mip_width, mip_height, mip_depth;
                get_mip_dim(mip_level, mip_width, mip_height, mip_depth);

                const uint mip_row_blocks = (mip_width + m_block_dim - 1) / m_block_dim;
                const uint mip_col_blocks = (mip_height + m_block_dim - 1) / m_block_dim;
                if ((!mip_row_blocks) || (!mip_col_blocks))
                {
                    return false;
                }

                expected_bytes_remaining += sizeof(uint32);

                if ((!m_header.m_numberOfArrayElements) && (get_num_faces() == 6))
                {
                    for (uint face = 0; face < get_num_faces(); face++)
                    {
                        uint slice_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
                        expected_bytes_remaining += slice_size;

                        uint num_cube_pad_bytes = 3 - ((slice_size + 3) % 4);
                        expected_bytes_remaining += num_cube_pad_bytes;
                    }
                }
                else
                {
                    uint total_mip_size = 0;
                    for (uint array_element = 0; array_element < get_array_size(); array_element++)
                    {
                        for (uint face = 0; face < get_num_faces(); face++)
                        {
                            for (uint zslice = 0; zslice < mip_depth; zslice++)
                            {
                                uint slice_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
                                total_mip_size += slice_size;
                            }
                        }
                    }
                    expected_bytes_remaining += total_mip_size;

                    uint num_mip_pad_bytes = 3 - ((total_mip_size + 3) % 4);
                    expected_bytes_remaining += num_mip_pad_bytes;
                }
            }

            if (serializer.get_stream()->get_remaining() < expected_bytes_remaining)
            {
                has_valid_image_size_fields = false;
                disable_mip_and_cubemap_padding = true;
                console::warning("ktx_texture::read_from_stream: KTX file size is smaller than expected - trying to read anyway without imageSize fields");
            }
        }
#endif

        for (uint mip_level = 0; mip_level < get_num_mips(); mip_level++)
        {
            uint mip_width, mip_height, mip_depth;
            get_mip_dim(mip_level, mip_width, mip_height, mip_depth);

            const uint mip_row_blocks = (mip_width + m_block_dim - 1) / m_block_dim;
            const uint mip_col_blocks = (mip_height + m_block_dim - 1) / m_block_dim;
            if ((!mip_row_blocks) || (!mip_col_blocks))
            {
                return false;
            }

            uint32 image_size = 0;
            if (!has_valid_image_size_fields)
            {
                image_size = mip_depth * mip_row_blocks * mip_col_blocks * m_bytes_per_block * get_array_size() * get_num_faces();
            }
            else
            {
                if (serializer.read(&image_size, 1, sizeof(image_size)) != sizeof(image_size))
                {
                    return false;
                }

                if (m_opposite_endianness)
                {
                    image_size = utils::swap32(image_size);
                }
            }

            if (!image_size)
            {
                return false;
            }

            uint total_mip_size = 0;

            if ((!m_header.m_numberOfArrayElements) && (get_num_faces() == 6))
            {
                // plain non-array cubemap
                for (uint face = 0; face < get_num_faces(); face++)
                {
                    CRNLIB_ASSERT(m_image_data.size() == get_image_index(mip_level, 0, face, 0));

                    m_image_data.push_back(uint8_vec());
                    uint8_vec& image_data = m_image_data.back();

                    image_data.resize(image_size);
                    if (serializer.read(&image_data[0], 1, image_size) != image_size)
                    {
                        return false;
                    }

                    if (m_opposite_endianness)
                    {
                        utils::endian_swap_mem(&image_data[0], image_size, m_header.m_glTypeSize);
                    }

                    uint num_cube_pad_bytes = disable_mip_and_cubemap_padding ? 0 : (3 - ((image_size + 3) % 4));
                    if (serializer.read(pad_bytes, 1, num_cube_pad_bytes) != num_cube_pad_bytes)
                    {
                        return false;
                    }

                    total_mip_size += image_size + num_cube_pad_bytes;
                }
            }
            else
            {
                // 1D, 2D, 3D (normal or array texture), or array cubemap
                uint num_image_bytes_remaining = image_size;

                for (uint array_element = 0; array_element < get_array_size(); array_element++)
                {
                    for (uint face = 0; face < get_num_faces(); face++)
                    {
                        for (uint zslice = 0; zslice < mip_depth; zslice++)
                        {
                            CRNLIB_ASSERT(m_image_data.size() == get_image_index(mip_level, array_element, face, zslice));

                            uint slice_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
                            if ((!slice_size) || (slice_size > num_image_bytes_remaining))
                            {
                                return false;
                            }

                            m_image_data.push_back(uint8_vec());
                            uint8_vec& image_data = m_image_data.back();

                            image_data.resize(slice_size);
                            if (serializer.read(&image_data[0], 1, slice_size) != slice_size)
                            {
                                return false;
                            }

                            if (m_opposite_endianness)
                            {
                                utils::endian_swap_mem(&image_data[0], slice_size, m_header.m_glTypeSize);
                            }

                            num_image_bytes_remaining -= slice_size;

                            total_mip_size += slice_size;
                        }
                    }
                }

                if (num_image_bytes_remaining)
                {
                    return false;
                }
            }

            uint num_mip_pad_bytes = disable_mip_and_cubemap_padding ? 0 : (3 - ((total_mip_size + 3) % 4));
            if (serializer.read(pad_bytes, 1, num_mip_pad_bytes) != num_mip_pad_bytes)
            {
                return false;
            }
        }
        return true;
    }